

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBins(BamStandardIndex *this,int *refId,BaiBinMap *bins)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  BamException *this_00;
  allocator local_66;
  allocator local_65;
  int32_t binCount;
  string local_60;
  string local_40;
  
  binCount = (int32_t)(bins->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&binCount);
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&binCount,4);
  if (CONCAT44(extraout_var,iVar2) == 4) {
    local_60._M_dataplus._M_p._0_4_ =
         (undefined4)(bins->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    SaveBinsSummary(this,refId,(int *)&local_60);
    for (p_Var3 = (bins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(bins->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      WriteBin(this,&p_Var3[1]._M_color,(BaiAlignmentChunkVector *)&p_Var3[1]._M_parent);
    }
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_60,"BamStandardIndex::WriteBins",&local_65);
  std::__cxx11::string::string((string *)&local_40,"could not write bin count",&local_66);
  BamException::BamException(this_00,&local_60,&local_40);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteBins(const int& refId, BaiBinMap& bins)
{

    // write number of bins
    int32_t binCount = bins.size();
    if (m_isBigEndian) SwapEndian_32(binCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&binCount, sizeof(binCount));
    if (numBytesWritten != sizeof(binCount))
        throw BamException("BamStandardIndex::WriteBins", "could not write bin count");

    // save summary for reference's bins
    SaveBinsSummary(refId, bins.size());

    // iterate over bins
    BaiBinMap::iterator binIter = bins.begin();
    BaiBinMap::iterator binEnd = bins.end();
    for (; binIter != binEnd; ++binIter)
        WriteBin((*binIter).first, (*binIter).second);
}